

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O0

bool __thiscall
HawkTracer::parser::KlassRegister::klass_exists(KlassRegister *this,HT_EventKlassId klass_id)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_false>
  local_40 [3];
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_false>
  local_28;
  lock_guard<std::mutex> local_20;
  lock_guard l;
  HT_EventKlassId klass_id_local;
  KlassRegister *this_local;
  
  l._M_device._4_4_ = klass_id;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_register_mtx);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>_>
       ::find(&this->_register,(key_type *)((long)&l._M_device + 4));
  local_40[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>_>
       ::end(&this->_register);
  bVar1 = std::__detail::operator!=(&local_28,local_40);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return bVar1;
}

Assistant:

bool KlassRegister::klass_exists(HT_EventKlassId klass_id) const
{
    lock_guard l(_register_mtx);
    return _register.find(klass_id) != _register.end();
}